

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemv.hpp
# Opt level: O0

void remora::bindings::
     gemv_impl<remora::vector<double,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::vector<double,remora::cpu_tag>>
               (vector<double,_remora::cpu_tag> *param_1,
               matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
               *param_2,undefined8 param_3,
               vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag> *param_4)

{
  double dVar1;
  matrix<double,_remora::row_major,_remora::cpu_tag> *this;
  size_type sVar2;
  reference pvVar3;
  size_t i;
  value_type value;
  size_type in_stack_ffffffffffffff88;
  vector<double,_remora::cpu_tag> *this_00;
  undefined1 local_50 [8];
  size_type in_stack_ffffffffffffffb8;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffffc0;
  size_type local_38;
  double local_30;
  vector<double,_remora::cpu_tag> *local_28;
  vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag> *local_20;
  undefined8 local_18;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_10;
  
  local_38 = 0;
  local_28 = param_1;
  local_20 = param_4;
  local_18 = param_3;
  local_10 = param_2;
  while( true ) {
    this = matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_10);
    sVar2 = matrix<double,_remora::row_major,_remora::cpu_tag>::size1(this);
    if (local_38 == sVar2) break;
    row<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    dot<remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>,remora::vector<double,remora::cpu_tag>,double>
              (local_50,local_18,&local_30);
    dVar1 = local_30;
    if ((local_30 != 0.0) || (NAN(local_30))) {
      this_00 = local_28;
      vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag>::operator()
                (local_20);
      pvVar3 = vector<double,_remora::cpu_tag>::operator()(this_00,in_stack_ffffffffffffff88);
      *pvVar3 = (double)this_00 * dVar1 + *pvVar3;
    }
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void gemv_impl(
	matrix_expression<MatA, cpu_tag> const& A,
	vector_expression<V, cpu_tag> const& x,
	vector_expression<ResultV, cpu_tag>& result, 
	typename ResultV::value_type alpha,
	row_major
) {
	typedef typename ResultV::value_type value_type;
	value_type value;
	for(std::size_t i = 0; i != A().size1();++i){
		bindings::dot(row(A,i), x, value,  typename MatA::evaluation_category::tag(), typename V::evaluation_category::tag());
		if(value != value_type())//handling of sparse results.
			result()(i) += alpha * value;
	}
}